

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::check_physical_type_cast
          (CompilerMSL *this,string *expr,SPIRType *type,uint32_t physical_type)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  char (*in_stack_ffffffffffffff98) [2];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  uVar2 = (ulong)physical_type;
  if ((uVar2 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar2].type == TypeType)) {
    pSVar3 = Variant::get<spirv_cross::SPIRType>(pVVar1 + uVar2);
  }
  else {
    pSVar3 = (SPIRType *)0x0;
  }
  if (((pSVar3 != (SPIRType *)0x0) && (pSVar3->storage == StorageClassPhysicalStorageBuffer)) &&
     (*(int *)&(pSVar3->super_IVariant).field_0xc == 10)) {
    if (1 < pSVar3->vecsize) {
      ::std::__cxx11::string::append((char *)expr);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              ((char (*) [3])local_60,this,type,0);
    join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_40,(spirv_cross *)0x352693,(char (*) [3])local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
               in_stack_ffffffffffffff98);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  return;
}

Assistant:

void CompilerMSL::check_physical_type_cast(std::string &expr, const SPIRType *type, uint32_t physical_type)
{
	auto *p_physical_type = maybe_get<SPIRType>(physical_type);
	if (p_physical_type &&
		p_physical_type->storage == StorageClassPhysicalStorageBuffer &&
		p_physical_type->basetype == to_unsigned_basetype(64))
	{
		if (p_physical_type->vecsize > 1)
			expr += ".x";

		expr = join("((", type_to_glsl(*type), ")", expr, ")");
	}
}